

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void handle_token(string *v,size_t s,size_t l,list<SToken,_std::allocator<SToken>_> *tokens)

{
  int iVar1;
  char *pcVar2;
  SToken local_a0;
  SToken local_88;
  SToken local_60;
  string local_48 [8];
  string t;
  list<SToken,_std::allocator<SToken>_> *tokens_local;
  size_t l_local;
  size_t s_local;
  string *v_local;
  
  if (l == 0) {
    return;
  }
  std::__cxx11::string::substr((ulong)local_48,(ulong)v);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = strcasecmp("true",pcVar2);
  if (iVar1 != 0) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iVar1 = strcasecmp("false",pcVar2);
    if (iVar1 != 0) {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
      if (*pcVar2 == '\'') {
        SToken::SToken(&local_88,STRING,s,l);
        std::__cxx11::list<SToken,_std::allocator<SToken>_>::push_back(tokens,&local_88);
      }
      else {
        SToken::SToken(&local_a0,NUMBER,s,l);
        std::__cxx11::list<SToken,_std::allocator<SToken>_>::push_back(tokens,&local_a0);
      }
      goto LAB_001047b0;
    }
  }
  SToken::SToken(&local_60,BOOLEAN,s,l);
  std::__cxx11::list<SToken,_std::allocator<SToken>_>::push_back(tokens,&local_60);
LAB_001047b0:
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void handle_token(const std::string& v, size_t s, size_t l, std::list<SToken>& tokens)
{
    if (0 == l)
    {
        return;
    }
    
    std::string t = v.substr(s, l);
    if (0 == strcasecmp("true", t.c_str())
        || 0 == strcasecmp("false", t.c_str()))
    {
        tokens.push_back(SToken(BOOLEAN, s, l));
    }
    else if ('\'' == t[0])
    {
        tokens.push_back(SToken(STRING, s, l));
    }
    else
    {
        tokens.push_back(SToken(NUMBER, s, l));
    }
}